

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingBar::~IfcReinforcingBar(IfcReinforcingBar *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject = pvVar1;
  *(void **)((long)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                    super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x3f];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 =
       vtt[0x40];
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x41];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 =
       vtt[0x42];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.field_0x100 = vtt[0x43];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.field_0x138 = vtt[0x44];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.field_0x148 = vtt[0x45];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.field_0x158 = vtt[0x46];
  *(void **)&(this->super_IfcReinforcingElement).field_0x190 = vtt[0x47];
  std::__cxx11::string::~string((string *)&this->BarSurface);
  std::__cxx11::string::~string((string *)&this->BarRole);
  Schema_2x3::IfcReinforcingElement::~IfcReinforcingElement
            (&this->super_IfcReinforcingElement,vtt + 1);
  return;
}

Assistant:

IfcReinforcingBar() : Object("IfcReinforcingBar") {}